

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O1

bool __thiscall flatbuffers::jsons::JsonSchemaGenerator::save(JsonSchemaGenerator *this)

{
  bool bVar1;
  string file_path;
  string local_30;
  
  GeneratedFileName(&local_30,this,(this->super_BaseGenerator).path_,
                    (this->super_BaseGenerator).file_name_,
                    &((this->super_BaseGenerator).parser_)->opts);
  bVar1 = SaveFile(local_30._M_dataplus._M_p,(this->code_)._M_dataplus._M_p,
                   (this->code_)._M_string_length,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool save() const {
    const auto file_path = GeneratedFileName(path_, file_name_, parser_.opts);
    return SaveFile(file_path.c_str(), code_, false);
  }